

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputParser.cpp
# Opt level: O1

string * __thiscall
InputParser::removeQuotes(string *__return_storage_ptr__,InputParser *this,string *sentence)

{
  pointer pcVar1;
  char *pcVar2;
  long *local_38 [2];
  long local_28 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (sentence->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sentence->_M_string_length);
  if (__return_storage_ptr__->_M_string_length != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if ((*pcVar2 == '\"') && (pcVar2[__return_storage_ptr__->_M_string_length - 1] == '\"')) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0],local_28[0] + 1);
      }
    }
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

string InputParser::removeQuotes(const string &sentence) {
    string ret(sentence);

    if (ret.at(0) == '"' && ret.at(ret.size()-1) == '"')
        ret = ret.substr(1, ret.size()-2);

   return ret;
}